

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::analysis::ConstantManager::GetNullConstId(ConstantManager *this,Type *type)

{
  uint32_t uVar1;
  Constant *c_00;
  Instruction *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  Constant *local_20;
  Constant *c;
  Type *type_local;
  ConstantManager *this_local;
  
  c = (Constant *)type;
  type_local = (Type *)this;
  memset(&local_38,0,0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_38);
  c_00 = GetConstant(this,type,&local_38);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_38);
  local_20 = c_00;
  this_00 = GetDefiningInstruction(this,c_00,0,(inst_iterator *)0x0);
  uVar1 = opt::Instruction::result_id(this_00);
  return uVar1;
}

Assistant:

uint32_t ConstantManager::GetNullConstId(const Type* type) {
  const Constant* c = GetConstant(type, {});
  return GetDefiningInstruction(c)->result_id();
}